

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v10::detail::format_string_checker<char>::format_string_checker
          (format_string_checker<char> *this,basic_string_view<char> fmt)

{
  parse_func *local_50;
  format_string_checker<char> *local_38;
  format_string_checker<char> *this_local;
  basic_string_view<char> fmt_local;
  
  local_38 = this;
  do {
    local_38->types_[0] = none_type;
    local_38 = (format_string_checker<char> *)&local_38->field_0x4;
  } while (local_38 != (format_string_checker<char> *)&this->field_0x4);
  compile_parse_context<char>::compile_parse_context(&this->context_,fmt,0,this->types_,0);
  local_50 = this->parse_funcs_;
  do {
    *local_50 = (parse_func)0x0;
    local_50 = local_50 + 1;
  } while ((format_string_checker<char> *)local_50 != this + 1);
  return;
}

Assistant:

explicit FMT_CONSTEXPR format_string_checker(basic_string_view<Char> fmt)
      : types_{mapped_type_constant<Args, buffer_context<Char>>::value...},
        context_(fmt, num_args, types_),
        parse_funcs_{&parse_format_specs<Args, parse_context_type>...} {}